

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O0

void av1_setup_block_planes(MACROBLOCKD *xd,int ss_x,int ss_y,int num_planes)

{
  int iVar1;
  PLANE_TYPE PVar2;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  for (local_18 = 0; iVar1 = in_ECX, local_18 < in_ECX; local_18 = local_18 + 1) {
    PVar2 = get_plane_type(local_18);
    *(PLANE_TYPE *)(in_RDI + 0x10 + (long)local_18 * 0xa30) = PVar2;
    local_1c = in_ESI;
    if (local_18 == 0) {
      local_1c = 0;
    }
    *(undefined4 *)(in_RDI + (long)local_18 * 0xa30 + 0x14) = local_1c;
    local_20 = in_EDX;
    if (local_18 == 0) {
      local_20 = 0;
    }
    *(undefined4 *)(in_RDI + (long)local_18 * 0xa30 + 0x18) = local_20;
  }
  while (local_18 = iVar1, local_18 < 3) {
    *(undefined4 *)(in_RDI + (long)local_18 * 0xa30 + 0x14) = 1;
    *(undefined4 *)(in_RDI + (long)local_18 * 0xa30 + 0x18) = 1;
    iVar1 = local_18 + 1;
  }
  return;
}

Assistant:

void av1_setup_block_planes(MACROBLOCKD *xd, int ss_x, int ss_y,
                            const int num_planes) {
  int i;

  for (i = 0; i < num_planes; i++) {
    xd->plane[i].plane_type = get_plane_type(i);
    xd->plane[i].subsampling_x = i ? ss_x : 0;
    xd->plane[i].subsampling_y = i ? ss_y : 0;
  }
  for (i = num_planes; i < MAX_MB_PLANE; i++) {
    xd->plane[i].subsampling_x = 1;
    xd->plane[i].subsampling_y = 1;
  }
}